

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

int has_ext(char *ext)

{
  char **ppcVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  byte *__haystack;
  long lVar10;
  
  ppcVar1 = exts_i;
  if (GLVersion.major < 3) {
    uVar8 = 0;
    __haystack = (byte *)exts;
    if (ext != (char *)0x0 && exts != (char *)0x0) {
      do {
        pbVar4 = (byte *)strstr((char *)__haystack,ext);
        if (pbVar4 == (byte *)0x0) {
          return 0;
        }
        sVar5 = strlen(ext);
        pbVar6 = pbVar4 + sVar5;
      } while (((pbVar4 != __haystack) && (__haystack = pbVar6, pbVar4[-1] != 0x20)) ||
              (__haystack = pbVar6, (*pbVar6 & 0xdf) != 0));
      uVar8 = 1;
    }
  }
  else {
    lVar10 = (long)num_exts_i;
    uVar9 = 0;
    uVar2 = 0;
    if (0 < num_exts_i) {
      uVar9 = (ulong)(uint)num_exts_i;
    }
    do {
      uVar7 = uVar2;
      if (uVar9 == uVar7) break;
      iVar3 = strcmp(ppcVar1[uVar7],ext);
      uVar2 = uVar7 + 1;
    } while (iVar3 != 0);
    uVar8 = (uint)((long)uVar7 < lVar10);
  }
  return uVar8;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(GLVersion.major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}